

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsessionparams.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSessionParams::SetUsePollThread(RTPSessionParams *this,bool usethread)

{
  return -2;
}

Assistant:

int RTPSessionParams::SetUsePollThread(bool usethread)
{
#ifndef RTP_SUPPORT_THREAD
	JRTPLIB_UNUSED(usethread);
	return ERR_RTP_NOTHREADSUPPORT;
#else
	usepollthread = usethread;
	return 0;
#endif // RTP_SUPPORT_THREAD
}